

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
LargeGapGrayCode::computeRunLengths
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,LargeGapGrayCode *this,int bitWidth)

{
  bool bVar1;
  reference __x;
  size_type sVar2;
  reference pvVar3;
  pointer ppVar4;
  int local_94;
  pair<int,_int> local_90;
  _Self local_88;
  _Self local_80;
  iterator it;
  int local_70;
  int runLength;
  int i;
  int runThrough;
  allocator<int> local_55;
  value_type_conflict local_54;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> transitionLastSeen;
  vector<int,_std::allocator<int>_> t;
  int bitWidth_local;
  LargeGapGrayCode *this_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *numRunLengths;
  
  __x = std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[](&this->m_transitionSequences,(long)(bitWidth + -1));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x);
  local_54 = -1;
  std::allocator<int>::allocator(&local_55);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,(long)bitWidth,&local_54,&local_55);
  std::allocator<int>::~allocator(&local_55);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (__return_storage_ptr__);
  for (runLength = 1; runLength < 3; runLength = runLength + 1) {
    for (local_70 = 0;
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage),
        (ulong)(long)local_70 < sVar2; local_70 = local_70 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_70);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar3);
      if (*pvVar3 == -1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_70);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar3);
        *pvVar3 = local_70;
      }
      else {
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_70);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar3);
        it._M_node._4_4_ = (runLength * (int)sVar2 + local_70) - *pvVar3;
        sVar2 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)
                           &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_70);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,(long)*pvVar3);
        *pvVar3 = runLength * (int)sVar2 + local_70;
        if (runLength == 2) {
          local_80._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                         (__return_storage_ptr__,(key_type *)((long)&it._M_node + 4));
          local_88._M_node =
               (_Base_ptr)
               std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                         (__return_storage_ptr__);
          bVar1 = std::operator!=(&local_80,&local_88);
          if (bVar1) {
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_80);
            ppVar4->second = ppVar4->second + 1;
          }
          else {
            local_94 = 1;
            local_90 = std::make_pair<int&,int>((int *)((long)&it._M_node + 4),&local_94);
            std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
            insert<std::pair<int,int>>
                      ((map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)
                       __return_storage_ptr__,&local_90);
          }
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &transitionLastSeen.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, int> LargeGapGrayCode::computeRunLengths(int bitWidth)
{
	std::vector<int> t = m_transitionSequences[bitWidth-1];
	std::vector<int> transitionLastSeen(bitWidth, -1);

	std::map<int, int> numRunLengths;

	for(int runThrough = 1; runThrough <= 2; ++runThrough) {
		for(int i = 0; i < t.size(); ++i) {
			if(transitionLastSeen[t[i]] == -1) {
				transitionLastSeen[t[i]] = i;
			}
			else {
				int runLength = runThrough*t.size()+i-transitionLastSeen[t[i]];
				transitionLastSeen[t[i]] = runThrough*t.size()+i;

				if(runThrough == 2) {
					std::map<int, int>::iterator it = numRunLengths.find(runLength);
					if (it != numRunLengths.end()) {
					    it->second += 1;
					}
					else {
						numRunLengths.insert(std::make_pair(runLength, 1));
					}
				}
			}
		}
	}

	return numRunLengths;
}